

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O0

Symbols * __thiscall
inipp::Ini<char>::local_symbols
          (Symbols *__return_storage_ptr__,Ini<char> *this,String *sec_name,Section *sec)

{
  bool bVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  reference local_50;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *val;
  const_iterator __end0;
  const_iterator __begin0;
  Section *__range2;
  Section *sec_local;
  String *sec_name_local;
  Ini<char> *this_local;
  Symbols *result;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(__return_storage_ptr__);
  __end0 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(sec);
  val = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(sec);
  while (bVar1 = std::operator!=(&__end0,(_Self *)&val), bVar1) {
    local_50 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&__end0);
    peVar2 = std::__shared_ptr_access<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->format);
    Format<char>::local_symbol(&local_70,peVar2,&local_50->first);
    peVar2 = std::__shared_ptr_access<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->format);
    Format<char>::global_symbol(&local_a0,peVar2,sec_name,&local_50->first);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::__cxx11::string_const,std::__cxx11::string_const>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)__return_storage_ptr__,&local_70,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_70);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

const Symbols local_symbols(const String & sec_name, const Section & sec) const {
		Symbols result;
		for (const auto & val : sec)
			result.emplace_back(format->local_symbol(val.first), format->global_symbol(sec_name, val.first));
		return result;
	}